

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O3

void TTD::SnapShot::DoSnapshotCompare(SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *this;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *this_00;
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  TTDCompareTag TVar4;
  SnapRootInfoEntry *pSVar5;
  SnapContext *pSVar6;
  int *piVar7;
  UnorderedArrayListLink *pUVar8;
  int *piVar9;
  UnorderedArrayListLink *pUVar10;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this_01;
  UnorderedArrayListLink *pUVar11;
  undefined8 *puVar12;
  SnapRootInfoEntry *pSVar13;
  SnapContext *snapCtx2;
  SnapContext *ctx1;
  SnapRootInfoEntry *pSVar14;
  SnapContext *snapCtx1;
  int *piVar15;
  SnapContext *pSVar16;
  int *piVar17;
  bool bVar18;
  undefined1 auStack_e8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap2;
  undefined1 auStack_a8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap1;
  TTDCompareTag ctag;
  uint local_64;
  TTD_PTR_ID local_58;
  TTD_PTR_ID ptrId2;
  SnapRootInfoEntry *local_48;
  TTD_PTR_ID ptrId1;
  SlotArrayInfo *sai1;
  SlotArrayInfo *sai2;
  
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap1->m_rootList)
  ;
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap2->m_rootList)
  ;
  TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
  auStack_a8 = (undefined1  [8])0x0;
  allRootMap1.buckets = (Type)0x0;
  allRootMap1.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap1.alloc = (Type)0x0;
  allRootMap1.size = 0;
  allRootMap1.count = 0;
  allRootMap1.freeList = 0x4b;
  allRootMap1.freeCount = 0;
  allRootMap1.modFunctionIndex = 0;
  auStack_e8 = (undefined1  [8])0x0;
  allRootMap2.buckets = (Type)0x0;
  allRootMap2.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap2.alloc = (Type)0x0;
  allRootMap2.size = 0;
  allRootMap2.count = 0;
  allRootMap2.freeList = 0x4b;
  allRootMap2.freeCount = 0;
  allRootMap2.modFunctionIndex = 0;
  pSVar13 = (snap1->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar14 = (snap1->m_rootList).m_inlineHeadBlock.BlockData;
  ptrId2 = (TTD_PTR_ID)snap1;
  if (pSVar14 != (SnapRootInfoEntry *)0x0 && pSVar14 != pSVar13) {
    pUVar11 = (snap1->m_rootList).m_inlineHeadBlock.Next;
    do {
      local_48 = pSVar14;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)auStack_a8,&pSVar14->LogId,&local_48);
      pSVar14 = pSVar14 + 1;
      if (pSVar14 == pSVar13) {
        if (pUVar11 == (UnorderedArrayListLink *)0x0) break;
        pSVar13 = pUVar11->CurrPos;
        pSVar14 = pUVar11->BlockData;
        pUVar11 = pUVar11->Next;
      }
    } while (pSVar14 != (SnapRootInfoEntry *)0x0);
  }
  pSVar13 = (snap2->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar14 = (snap2->m_rootList).m_inlineHeadBlock.BlockData;
  if (pSVar14 != (SnapRootInfoEntry *)0x0 && pSVar14 != pSVar13) {
    pUVar11 = (snap2->m_rootList).m_inlineHeadBlock.Next;
    do {
      local_48 = pSVar14;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)auStack_e8,&pSVar14->LogId,&local_48);
      pSVar5 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_a8,&local_48->LogId);
      TTDCompareMap::DiagnosticAssert
                (compareMap,pSVar5->MaybeLongLivedRoot == local_48->MaybeLongLivedRoot);
      pSVar5 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_a8,&local_48->LogId);
      TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Root
                (compareMap,pSVar5->LogObject,local_48->LogObject,local_48->LogId);
      pSVar14 = pSVar14 + 1;
      if (pSVar14 == pSVar13) {
        if (pUVar11 == (UnorderedArrayListLink *)0x0) break;
        pSVar13 = pUVar11->CurrPos;
        pSVar14 = pUVar11->BlockData;
        pUVar11 = pUVar11->Next;
      }
    } while (pSVar14 != (SnapRootInfoEntry *)0x0);
  }
  TTDCompareMap::DiagnosticAssert
            (compareMap,*(TTD_LOG_PTR_ID *)(ptrId2 + 0x90) == snap2->m_activeScriptContext);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
                    ((UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)(ptrId2 + 0x40));
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&snap2->m_ctxList);
  TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
  pSVar16 = *(SnapContext **)(ptrId2 + 0x40);
  snapCtx1 = *(SnapContext **)(ptrId2 + 0x50);
  if (snapCtx1 != (SnapContext *)0x0 && snapCtx1 != pSVar16) {
    puVar12 = *(undefined8 **)(ptrId2 + 0x58);
    do {
      pSVar6 = (snap2->m_ctxList).m_inlineHeadBlock.CurrPos;
      snapCtx2 = (snap2->m_ctxList).m_inlineHeadBlock.BlockData;
      if (snapCtx2 != (SnapContext *)0x0 && snapCtx2 != pSVar6) {
        pUVar8 = (snap2->m_ctxList).m_inlineHeadBlock.Next;
        do {
          if (snapCtx1->ScriptContextLogId == snapCtx2->ScriptContextLogId) goto LAB_009176e7;
          snapCtx2 = snapCtx2 + 1;
          if (snapCtx2 == pSVar6) {
            if (pUVar8 == (UnorderedArrayListLink *)0x0) break;
            pSVar6 = pUVar8->CurrPos;
            snapCtx2 = pUVar8->BlockData;
            pUVar8 = pUVar8->Next;
          }
        } while (snapCtx2 != (SnapContext *)0x0);
      }
      snapCtx2 = (SnapContext *)0x0;
LAB_009176e7:
      TTDCompareMap::DiagnosticAssert(compareMap,snapCtx2 != (SnapContext *)0x0);
      NSSnapValues::AssertSnapEquiv
                (snapCtx1,snapCtx2,
                 (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)auStack_a8,
                 (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)auStack_e8,compareMap);
      snapCtx1 = snapCtx1 + 1;
      if (snapCtx1 == pSVar16) {
        if (puVar12 == (undefined8 *)0x0) break;
        pSVar16 = (SnapContext *)*puVar12;
        snapCtx1 = (SnapContext *)puVar12[2];
        puVar12 = (undefined8 *)puVar12[3];
      }
    } while (snapCtx1 != (SnapContext *)0x0);
  }
  uVar2 = UnorderedArrayList<int,_32UL>::Count((UnorderedArrayList<int,_32UL> *)(ptrId2 + 0x68));
  uVar3 = UnorderedArrayList<int,_32UL>::Count(&snap2->m_tcSymbolRegistrationMapContents);
  TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
  piVar15 = *(int **)(ptrId2 + 0x68);
  piVar17 = *(int **)(ptrId2 + 0x78);
  if (piVar17 != (int *)0x0 && piVar17 != piVar15) {
    puVar12 = *(undefined8 **)(ptrId2 + 0x80);
    do {
      piVar7 = (snap2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
      piVar9 = (snap2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
      if (piVar9 == (int *)0x0 || piVar9 == piVar7) {
        bVar18 = false;
      }
      else {
        pUVar10 = (snap2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
        do {
          bVar18 = *piVar9 == *piVar17;
          if (bVar18) break;
          piVar9 = piVar9 + 1;
          if (piVar9 == piVar7) {
            if (pUVar10 == (UnorderedArrayListLink *)0x0) break;
            piVar7 = pUVar10->CurrPos;
            piVar9 = pUVar10->BlockData;
            pUVar10 = pUVar10->Next;
          }
        } while (piVar9 != (int *)0x0);
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar18);
      piVar17 = piVar17 + 1;
      if (piVar17 == piVar15) {
        if (puVar12 == (undefined8 *)0x0) break;
        piVar15 = (int *)*puVar12;
        piVar17 = (int *)puVar12[2];
        puVar12 = (undefined8 *)puVar12[3];
      }
    } while (piVar17 != (int *)0x0);
  }
  allRootMap1.stats._0_4_ = 0;
  local_48 = (SnapRootInfoEntry *)0x0;
  local_58 = 0;
  TTDCompareMap::GetNextCompareInfo
            (compareMap,(TTDCompareTag *)&allRootMap1.stats,(TTD_PTR_ID *)&local_48,&local_58);
  ctag = Done;
  allRootMap1.stats._4_4_ = 0;
  local_64 = 0;
  do {
    switch(allRootMap1.stats._0_4_) {
    case 0:
      this = (UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)(ptrId2 + 0x1b8);
      TVar4 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(this);
      uVar1 = allRootMap1.stats._4_4_;
      if (TVar4 < ctag) {
        bVar18 = false;
      }
      else {
        TVar4 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                          (&snap2->m_slotArrayEntries);
        bVar18 = ctag <= TVar4;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar18);
      this_00 = (UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *)
                (ptrId2 + 400);
      uVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count(this_00)
      ;
      if (uVar2 < uVar1) {
        bVar18 = false;
      }
      else {
        uVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                          (&snap2->m_scopeEntries);
        bVar18 = uVar1 <= uVar2;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar18);
      this_01 = (UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *)(ptrId2 + 0x160);
      uVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count(this_01);
      if (uVar2 < local_64) {
        bVar18 = false;
      }
      else {
        uVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                          (&snap2->m_compoundObjectList);
        bVar18 = local_64 <= uVar2;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar18);
      uVar2 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(this);
      uVar3 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                        (&snap2->m_slotArrayEntries);
      TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
      uVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count(this_00)
      ;
      uVar3 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                        (&snap2->m_scopeEntries);
      TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
      uVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count(this_01);
      uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                        (&snap2->m_compoundObjectList);
      TTDCompareMap::DiagnosticAssert(compareMap,uVar2 == uVar3);
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_e8);
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_a8);
      return;
    case 1:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,SlotArray,(TTD_PTR_ID)local_48,(SlotArrayInfo **)&ptrId1,local_58,&sai1)
      ;
      NSSnapValues::AssertSnapEquiv((SlotArrayInfo *)ptrId1,sai1,compareMap);
      ctag = ctag + SlotArray;
      break;
    case 2:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,FunctionScopeInfo,(TTD_PTR_ID)local_48,
                 (ScriptFunctionScopeInfo **)&ptrId1,local_58,(ScriptFunctionScopeInfo **)&sai1);
      NSSnapValues::AssertSnapEquiv
                ((ScriptFunctionScopeInfo *)ptrId1,(ScriptFunctionScopeInfo *)sai1,compareMap);
      allRootMap1.stats._4_4_ = allRootMap1.stats._4_4_ + 1;
      break;
    case 3:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,TopLevelLoadFunction,(TTD_PTR_ID)local_48,&ptrId1,local_58,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case 4:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,TopLevelNewFunction,(TTD_PTR_ID)local_48,&ptrId1,local_58,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case 5:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,TopLevelEvalFunction,(TTD_PTR_ID)local_48,&ptrId1,local_58,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case 6:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,FunctionBody,(TTD_PTR_ID)local_48,(FunctionBodyResolveInfo **)&ptrId1,
                 local_58,(FunctionBodyResolveInfo **)&sai1);
      NSSnapValues::AssertSnapEquiv
                ((FunctionBodyResolveInfo *)ptrId1,(FunctionBodyResolveInfo *)sai1,compareMap);
      break;
    case 7:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,SnapObject,(TTD_PTR_ID)local_48,(SnapObject **)&ptrId1,local_58,
                 (SnapObject **)&sai1);
      NSSnapObjects::AssertSnapEquiv((SnapObject *)ptrId1,(SnapObject *)sai1,compareMap);
      local_64 = local_64 + 1;
      break;
    default:
      TTDAbort_unrecoverable_error("Missing tag in case list!!!");
    }
    TTDCompareMap::GetNextCompareInfo
              (compareMap,(TTDCompareTag *)&allRootMap1.stats,(TTD_PTR_ID *)&local_48,&local_58);
  } while( true );
}

Assistant:

void SnapShot::DoSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        //compare the roots to kick things off
        compareMap.DiagnosticAssert(snap1->m_rootList.Count() == snap2->m_rootList.Count());

        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap1(&HeapAllocator::Instance);
        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap2(&HeapAllocator::Instance);

        for(auto iter1 = snap1->m_rootList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry1 = iter1.Current();
            allRootMap1.AddNew(rootEntry1->LogId, rootEntry1);
        }

        for(auto iter2 = snap2->m_rootList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry2 = iter2.Current();
            allRootMap2.AddNew(rootEntry2->LogId, rootEntry2);

            bool ll1 = allRootMap1.Item(rootEntry2->LogId)->MaybeLongLivedRoot;
            compareMap.DiagnosticAssert(ll1 == rootEntry2->MaybeLongLivedRoot);

            TTD_PTR_ID id1 = allRootMap1.Item(rootEntry2->LogId)->LogObject;
            compareMap.CheckConsistentAndAddPtrIdMapping_Root(id1, rootEntry2->LogObject, rootEntry2->LogId);
        }

        //Get the script contexts into the mix
        compareMap.DiagnosticAssert(snap1->m_activeScriptContext == snap2->m_activeScriptContext);
        compareMap.DiagnosticAssert(snap1->m_ctxList.Count() == snap2->m_ctxList.Count());
        for(auto iter1 = snap1->m_ctxList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx1 = iter1.Current();
            const NSSnapValues::SnapContext* ctx2 = nullptr;
            for(auto iter2 = snap2->m_ctxList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(ctx1->ScriptContextLogId == iter2.Current()->ScriptContextLogId)
                {
                    ctx2 = iter2.Current();
                    break;
                }
            }
            compareMap.DiagnosticAssert(ctx2 != nullptr);

            NSSnapValues::AssertSnapEquiv(ctx1, ctx2, allRootMap1, allRootMap2, compareMap);
        }

        //compare the contents of the two thread context symbol maps
        compareMap.DiagnosticAssert(snap1->m_tcSymbolRegistrationMapContents.Count() == snap2->m_tcSymbolRegistrationMapContents.Count());
        for(auto iter1 = snap1->m_tcSymbolRegistrationMapContents.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const Js::PropertyId pid1 = *iter1.Current();
            bool match = false;
            for(auto iter2 = snap2->m_tcSymbolRegistrationMapContents.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(*iter2.Current() == pid1)
                {
                    match = true;
                    break;
                }
            }
            compareMap.DiagnosticAssert(match);
        }

        //Iterate on the worklist until we are done
        TTDCompareTag ctag = TTDCompareTag::Done;
        TTD_PTR_ID ptrId1 = TTD_INVALID_PTR_ID;
        TTD_PTR_ID ptrId2 = TTD_INVALID_PTR_ID;

        uint32 comparedSlotArrays = 0;
        uint32 comparedScopes = 0;
        uint32 comparedObjects = 0;

        compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        while(ctag != TTDCompareTag::Done)
        {
            if(ctag == TTDCompareTag::SlotArray)
            {
                const NSSnapValues::SlotArrayInfo* sai1 = nullptr;
                const NSSnapValues::SlotArrayInfo* sai2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &sai1, ptrId2, &sai2);
                NSSnapValues::AssertSnapEquiv(sai1, sai2, compareMap);

                comparedSlotArrays++;
            }
            else if(ctag == TTDCompareTag::FunctionScopeInfo)
            {
                const NSSnapValues::ScriptFunctionScopeInfo* scope1 = nullptr;
                const NSSnapValues::ScriptFunctionScopeInfo* scope2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &scope1, ptrId2, &scope2);
                NSSnapValues::AssertSnapEquiv(scope1, scope2, compareMap);

                comparedScopes++;
            }
            else if(ctag == TTDCompareTag::TopLevelLoadFunction)
            {
                uint64 fload1 = 0;
                uint64 fload2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fload1, ptrId2, &fload2);
                compareMap.DiagnosticAssert(fload1 == fload2);
            }
            else if(ctag == TTDCompareTag::TopLevelNewFunction)
            {
                uint64 fnew1 = 0;
                uint64 fnew2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fnew1, ptrId2, &fnew2);
                compareMap.DiagnosticAssert(fnew1 == fnew2);
            }
            else if(ctag == TTDCompareTag::TopLevelEvalFunction)
            {
                uint64 feval1 = 0;
                uint64 feval2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &feval1, ptrId2, &feval2);
                compareMap.DiagnosticAssert(feval1 == feval2);
            }
            else if(ctag == TTDCompareTag::FunctionBody)
            {
                const NSSnapValues::FunctionBodyResolveInfo* fb1 = nullptr;
                const NSSnapValues::FunctionBodyResolveInfo* fb2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &fb1, ptrId2, &fb2);
                NSSnapValues::AssertSnapEquiv(fb1, fb2, compareMap);
            }
            else if(ctag == TTDCompareTag::SnapObject)
            {
                const NSSnapObjects::SnapObject* obj1 = nullptr;
                const NSSnapObjects::SnapObject* obj2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &obj1, ptrId2, &obj2);
                NSSnapObjects::AssertSnapEquiv(obj1, obj2, compareMap);

                comparedObjects++;
            }
            else
            {
                TTDAssert(false, "Missing tag in case list!!!");
            }

            compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        }

        //Make sure all objects/values have been matched -- well not quite since we don't align and treaverse WeakSet values we might not compare everything -- maybe improve later?
        compareMap.DiagnosticAssert(comparedSlotArrays <= snap1->m_slotArrayEntries.Count() && comparedSlotArrays <= snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(comparedScopes <= snap1->m_scopeEntries.Count() && comparedScopes <= snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(comparedObjects <= snap1->m_compoundObjectList.Count() && comparedObjects <= snap2->m_compoundObjectList.Count());

        compareMap.DiagnosticAssert(snap1->m_slotArrayEntries.Count() == snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_scopeEntries.Count() == snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_compoundObjectList.Count() == snap2->m_compoundObjectList.Count());

        //
        //TODO: if we missed something we may want to put code here to identify it
        //
    }